

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Gia_SimRsbMan_t * Gia_SimRsbAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_SimRsbMan_t *pGVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  Vec_Wrd_t *pVVar7;
  Vec_Wrd_t *pVVar8;
  size_t __nmemb;
  
  pGVar4 = (Gia_SimRsbMan_t *)calloc(1,0x58);
  pGVar4->pGia = pGia;
  iVar1 = pGia->vSimsPi->nSize;
  iVar2 = pGia->vCis->nSize;
  iVar3 = iVar1 / iVar2;
  pGVar4->nWords = iVar3;
  if (iVar1 % iVar2 != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x1d2,"Gia_SimRsbMan_t *Gia_SimRsbAlloc(Gia_Man_t *)");
  }
  __nmemb = (size_t)iVar3;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar4->pFunc[0] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar4->pFunc[1] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar4->pFunc[2] = pwVar5;
  pVVar6 = Vec_IntAlloc(1000);
  pGVar4->vTfo = pVVar6;
  pVVar6 = Vec_IntAlloc(1000);
  pGVar4->vCands = pVVar6;
  pVVar6 = Vec_IntAlloc(10);
  pGVar4->vFanins = pVVar6;
  pVVar6 = Vec_IntAlloc(10);
  pGVar4->vFanins2 = pVVar6;
  pVVar7 = Gia_ManSimPatSim(pGia);
  pGVar4->vSimsObj = pVVar7;
  pVVar8 = Vec_WrdStart(pVVar7->nSize);
  pGVar4->vSimsObj2 = pVVar8;
  if (iVar3 == pVVar7->nSize / pGia->nObjs) {
    Gia_ManStaticFanoutStart(pGia);
    return pGVar4;
  }
  __assert_fail("p->nWords == Vec_WrdSize(p->vSimsObj) / Gia_ManObjNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x1dc,"Gia_SimRsbMan_t *Gia_SimRsbAlloc(Gia_Man_t *)");
}

Assistant:

Gia_SimRsbMan_t * Gia_SimRsbAlloc( Gia_Man_t * pGia )
{
    Gia_SimRsbMan_t * p = ABC_CALLOC( Gia_SimRsbMan_t, 1 );
    p->pGia      = pGia;
    p->nWords    = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia); assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    p->pFunc[0]  = ABC_CALLOC( word, p->nWords );
    p->pFunc[1]  = ABC_CALLOC( word, p->nWords );
    p->pFunc[2]  = ABC_CALLOC( word, p->nWords );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vCands    = Vec_IntAlloc( 1000 );
    p->vFanins   = Vec_IntAlloc( 10 );
    p->vFanins2  = Vec_IntAlloc( 10 );
    p->vSimsObj  = Gia_ManSimPatSim( pGia );
    p->vSimsObj2 = Vec_WrdStart( Vec_WrdSize(p->vSimsObj) );
    assert( p->nWords == Vec_WrdSize(p->vSimsObj) / Gia_ManObjNum(pGia) );
    Gia_ManStaticFanoutStart( pGia );
    return p;
}